

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-ping-udp.c
# Opt level: O2

void pinger_write_ping(pinger_t_conflict *pinger)

{
  int iVar1;
  uv_buf_t local_18;
  
  local_18 = uv_buf_init(PING,5);
  iVar1 = uv_udp_try_send(&pinger->udp,&local_18,1,(sockaddr *)&pinger->server_addr);
  if (-1 < iVar1) {
    return;
  }
  fprintf(_stderr,"Fatal error in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-ping-udp.c"
          ,0x55,"uv_udp_send failed");
  fflush(_stderr);
  abort();
}

Assistant:

static void pinger_write_ping(pinger_t* pinger) {
  uv_buf_t buf;
  int r;

  buf = uv_buf_init(PING, sizeof(PING) - 1);
  r = uv_udp_try_send(&pinger->udp, &buf, 1,
                      (const struct sockaddr*) &pinger->server_addr);
  if (r < 0)
    FATAL("uv_udp_send failed");
}